

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.h
# Opt level: O0

void __thiscall Lexer::Lexer(Lexer *this)

{
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>_>
  __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>_>
  __l_00;
  initializer_list<std::pair<const_char,_lexemtype>_> __l_01;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>
  *local_2d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>
  *local_2a8;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>_>
  local_272;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_271;
  lexemtype local_270 [4];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>
  *local_260;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>
  local_258;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>
  local_230;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>
  local_208;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>
  local_1e0;
  iterator local_1b8;
  size_type local_1b0;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>_>
  local_1a6;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_1a5;
  lexemtype local_1a4 [5];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>
  *local_190;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>
  local_188;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>
  local_160;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>
  local_138;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>
  local_110;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>
  local_e8;
  iterator local_c0;
  size_type local_b8;
  allocator<std::pair<const_char,_lexemtype>_> local_9a;
  less<char> local_99;
  pair<const_char,_lexemtype> local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  iterator local_20;
  size_type local_18;
  Lexer *local_10;
  Lexer *this_local;
  
  local_38 = 0x1500000021;
  uStack_30 = 0x190000002c;
  local_48 = 0x130000002a;
  uStack_40 = 0x140000002f;
  local_58 = 0x110000002b;
  uStack_50 = 0x120000002d;
  local_68 = 0xf0000003c;
  uStack_60 = 0x100000003e;
  local_78 = 0x50000003b;
  uStack_70 = 0xd0000003d;
  local_88 = 0x300000028;
  uStack_80 = 0x400000029;
  local_98.first = '{';
  local_98._1_3_ = 0;
  local_98.second = OBRA;
  uStack_90 = 0x20000007d;
  local_20 = &local_98;
  local_18 = 0xe;
  local_10 = this;
  std::allocator<std::pair<const_char,_lexemtype>_>::allocator(&local_9a);
  __l_01._M_len = local_18;
  __l_01._M_array = local_20;
  std::map<char,_lexemtype,_std::less<char>,_std::allocator<std::pair<const_char,_lexemtype>_>_>::
  map(&this->SYMBOLS,__l_01,&local_99,&local_9a);
  std::allocator<std::pair<const_char,_lexemtype>_>::~allocator(&local_9a);
  local_190 = &local_188;
  local_1a4[4] = 7;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>
  ::pair<const_char_(&)[7],_lexemtype,_true>(local_190,(char (*) [7])"return",local_1a4 + 4);
  local_190 = &local_160;
  local_1a4[3] = IFKW;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>
  ::pair<const_char_(&)[3],_lexemtype,_true>(local_190,(char (*) [3])"if",local_1a4 + 3);
  local_190 = &local_138;
  local_1a4[2] = 9;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>
  ::pair<const_char_(&)[5],_lexemtype,_true>(local_190,(char (*) [5])"else",local_1a4 + 2);
  local_190 = &local_110;
  local_1a4[1] = 0xb;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>
  ::pair<const_char_(&)[6],_lexemtype,_true>(local_190,(char (*) [6])"while",local_1a4 + 1);
  local_190 = &local_e8;
  local_1a4[0] = FORKW;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>
  ::pair<const_char_(&)[4],_lexemtype,_true>(local_190,(char (*) [4])"for",local_1a4);
  local_c0 = &local_188;
  local_b8 = 5;
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>_>
  ::allocator(&local_1a6);
  __l_00._M_len = local_b8;
  __l_00._M_array = local_c0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>_>_>
  ::map(&this->KEYWORDS,__l_00,&local_1a5,&local_1a6);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>_>
  ::~allocator(&local_1a6);
  local_2a8 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>
               *)&local_c0;
  do {
    local_2a8 = local_2a8 + -1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>
    ::~pair(local_2a8);
  } while (local_2a8 != &local_188);
  local_260 = &local_258;
  local_270[3] = 6;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>
  ::pair<const_char_(&)[4],_lexemtype,_true>(local_260,(char (*) [4])"int",local_270 + 3);
  local_260 = &local_230;
  local_270[2] = 0x16;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>
  ::pair<const_char_(&)[7],_lexemtype,_true>(local_260,(char (*) [7])"double",local_270 + 2);
  local_260 = &local_208;
  local_270[1] = 0x17;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>
  ::pair<const_char_(&)[5],_lexemtype,_true>(local_260,(char (*) [5])"char",local_270 + 1);
  local_260 = &local_1e0;
  local_270[0] = FLOATKW;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>
  ::pair<const_char_(&)[6],_lexemtype,_true>(local_260,(char (*) [6])"float",local_270);
  local_1b8 = &local_258;
  local_1b0 = 4;
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>_>
  ::allocator(&local_272);
  __l._M_len = local_1b0;
  __l._M_array = local_1b8;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>_>_>
  ::map(&this->DATA_TYPES,__l,&local_271,&local_272);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>_>
  ::~allocator(&local_272);
  local_2d0 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>
               *)&local_1b8;
  do {
    local_2d0 = local_2d0 + -1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>
    ::~pair(local_2d0);
  } while (local_2d0 != &local_258);
  this->ch = ' ';
  memset(&this->lexem,0,0x28);
  Lexem::Lexem(&this->lexem);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>_>_>
  ::map(&this->table);
  return;
}

Assistant:

Lexer() = default;